

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

size_t __thiscall
gmlc::utilities::base64_decode
          (utilities *this,string_view encoded_string,void *data,size_t max_size)

{
  utilities uVar1;
  byte bVar2;
  char cVar3;
  undefined4 uVar4;
  utilities *puVar5;
  ulong uVar6;
  byte bVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  byte bVar11;
  uint uVar12;
  void *pvVar13;
  void *pvVar14;
  array<unsigned_char,_4UL> char_array_4;
  undefined4 local_30;
  byte local_2b [3];
  
  pcVar8 = encoded_string._M_str;
  local_30 = 0;
  uVar12 = 0;
  if (this == (utilities *)0x0) {
    pvVar13 = (void *)0x0;
  }
  else {
    puVar5 = (utilities *)0x0;
    pvVar13 = (void *)0x0;
    do {
      uVar1 = puVar5[encoded_string._M_len];
      if (((ulong)(byte)uVar1 == 0x3d) || ((&b64Map)[(byte)uVar1] == -1)) break;
      lVar9 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      *(utilities *)((long)&local_30 + lVar9) = uVar1;
      uVar4 = local_30;
      if (uVar12 == 4) {
        uVar6 = (ulong)(byte)local_30;
        bVar11 = (&b64Map)[local_30._1_1_];
        local_30._2_1_ = SUB41(uVar4,2);
        bVar2 = (&b64Map)[local_30._2_1_];
        local_30._3_1_ = SUB41(uVar4,3);
        cVar3 = (&b64Map)[local_30._3_1_];
        local_30 = CONCAT13(cVar3,CONCAT12(bVar2,CONCAT11(bVar11,(&b64Map)[uVar6])));
        bVar7 = bVar11 >> 4 & 3 | (&b64Map)[uVar6] << 2;
        bVar11 = bVar2 >> 2 & 0xf | bVar11 << 4;
        pvVar10 = (void *)((long)pvVar13 + 2);
        if (pvVar10 < data) {
          pcVar8[(long)pvVar13] = bVar7;
          (pcVar8 + 1)[(long)pvVar13] = bVar11;
          (pcVar8 + 2)[(long)pvVar13] = cVar3 + bVar2 * '@';
          pvVar13 = (void *)((long)pvVar13 + 3);
          uVar12 = 0;
        }
        else {
          pvVar14 = (void *)((long)pvVar13 + 1);
          if (pvVar14 < data) {
            pcVar8[(long)pvVar13] = bVar7;
LAB_003e0509:
            pcVar8[(long)pvVar14] = bVar11;
            return (size_t)pvVar10;
          }
          uVar12 = 0;
          pvVar10 = pvVar14;
          pvVar14 = pvVar13;
          bVar11 = bVar7;
          if (pvVar13 < data) goto LAB_003e0509;
        }
      }
      puVar5 = puVar5 + 1;
    } while (this != puVar5);
    if (0 < (int)uVar12) {
      if (uVar12 < 4) {
        memset((void *)((long)&local_30 + (ulong)uVar12),0,(ulong)(4 - uVar12));
      }
      local_2b[0] = (byte)(&b64Map)[local_30._1_1_] >> 4 & 3 | (&b64Map)[(byte)local_30] << 2;
      local_2b[1] = (byte)(&b64Map)[local_30._2_1_] >> 2 & 0xf | (&b64Map)[local_30._1_1_] << 4;
      local_2b[2] = (&b64Map)[local_30._2_1_] * '@' + (&b64Map)[local_30._3_1_];
      if (uVar12 != 1) {
        uVar6 = 0;
        do {
          if (pvVar13 < data) {
            pcVar8[(long)pvVar13] = local_2b[uVar6];
            pvVar13 = (void *)((long)pvVar13 + 1);
          }
          uVar6 = uVar6 + 1;
        } while (uVar12 - 1 != uVar6);
      }
    }
  }
  return (size_t)pvVar13;
}

Assistant:

size_t
    base64_decode(std::string_view encoded_string, void* data, size_t max_size)
{
    auto in_len = encoded_string.size();
    int indexOut = 0;
    int indexIn = 0;
    std::array<unsigned char, 3> char_array_3{{'\0', '\0', '\0'}};
    std::array<unsigned char, 4> char_array_4{{'\0', '\0', '\0', '\0'}};
    auto* outData = static_cast<unsigned char*>(data);
    size_t dataIndex = 0U;
    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];
            if (dataIndex + 2 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                outData[dataIndex++] = char_array_3[2];
            } else if (dataIndex + 1 < max_size) {
                outData[dataIndex++] = char_array_3[0];
                outData[dataIndex++] = char_array_3[1];
                return dataIndex;
            } else if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[0];
                return dataIndex;
            }

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            if (dataIndex < max_size) {
                outData[dataIndex++] = char_array_3[j];
            }
        }
    }
    return dataIndex;
}